

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O0

void __thiscall
cubeb_passthrough_resampler_fill_input_left_Test::TestBody
          (cubeb_passthrough_resampler_fill_input_left_Test *this)

{
  bool bVar1;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  long got;
  uint32_t i;
  float output [64];
  float input [96];
  long output_frame_count;
  long input_frame_count;
  passthrough_resampler<float> resampler;
  int iteration;
  uint32_t sample_rate;
  uint32_t channels;
  uint32_t in_stack_fffffffffffffc30;
  uint32_t in_stack_fffffffffffffc34;
  long *in_stack_fffffffffffffc38;
  cubeb_data_callback in_stack_fffffffffffffc40;
  undefined4 in_stack_fffffffffffffc48;
  int in_stack_fffffffffffffc4c;
  passthrough_resampler<float> *in_stack_fffffffffffffc50;
  Type in_stack_fffffffffffffc5c;
  AssertHelper *in_stack_fffffffffffffc60;
  long in_stack_fffffffffffffc80;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_fffffffffffffc88;
  long *in_stack_fffffffffffffc90;
  void *in_stack_fffffffffffffc98;
  passthrough_resampler<float> *in_stack_fffffffffffffca0;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_fffffffffffffca8;
  AssertHelper *in_stack_fffffffffffffcb0;
  AssertionResult local_340;
  uint local_32c;
  AssertionResult local_318;
  long local_308;
  uint local_2fc;
  undefined1 local_2f8 [256];
  float local_1f8 [98];
  undefined8 local_70;
  long local_68;
  undefined4 local_14;
  undefined4 local_10;
  undefined4 local_c;
  
  local_c = 2;
  local_10 = 0xac44;
  local_14 = 0;
  passthrough_resampler<float>::passthrough_resampler
            (in_stack_fffffffffffffc50,
             (cubeb_stream *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
             in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,in_stack_fffffffffffffc34,
             in_stack_fffffffffffffc30);
  local_68 = 0x30;
  local_70 = 0x20;
  memset(local_1f8,0,0x180);
  memset(local_2f8,0,0x100);
  for (local_2fc = 0;
      SBORROW8((ulong)local_2fc,local_68 * 2) != (long)((ulong)local_2fc + local_68 * -2) < 0;
      local_2fc = local_2fc + 1) {
    local_1f8[local_2fc] = (float)((double)local_2fc * 0.01);
  }
  local_14 = 1;
  local_308 = passthrough_resampler<float>::fill
                        (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
                         in_stack_fffffffffffffc90,in_stack_fffffffffffffc88._M_head_impl,
                         in_stack_fffffffffffffc80);
  testing::internal::EqHelper::Compare<long,_long,_nullptr>
            ((char *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
             (char *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,
             (long *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_318);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffc60);
    testing::AssertionResult::failure_message((AssertionResult *)0x1118c5);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c,(char *)in_stack_fffffffffffffc50
               ,in_stack_fffffffffffffc4c,(char *)in_stack_fffffffffffffc40);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffcb0,(Message *)in_stack_fffffffffffffca8._M_head_impl);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
    testing::Message::~Message((Message *)0x111915);
  }
  local_32c = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11193a);
  if (local_32c == 0) {
    testing::internal::EqHelper::Compare<long,_long,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
               (char *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,
               (long *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_340);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffc60);
      testing::AssertionResult::failure_message((AssertionResult *)0x1119a5);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c,
                 (char *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c,
                 (char *)in_stack_fffffffffffffc40);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffcb0,(Message *)in_stack_fffffffffffffca8._M_head_impl);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
      testing::Message::~Message((Message *)0x1119f5);
    }
    local_32c = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x111a1a);
    if (local_32c == 0) {
      local_68 = 0x20;
      local_14 = 2;
      local_308 = passthrough_resampler<float>::fill
                            (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
                             in_stack_fffffffffffffc90,in_stack_fffffffffffffc88._M_head_impl,
                             in_stack_fffffffffffffc80);
      testing::internal::EqHelper::Compare<long,_long,_nullptr>
                ((char *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                 (char *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,
                 (long *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
      bVar1 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xfffffffffffffca0);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffc60);
        testing::AssertionResult::failure_message((AssertionResult *)0x111ac3);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c,
                   (char *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c,
                   (char *)in_stack_fffffffffffffc40);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffcb0,(Message *)in_stack_fffffffffffffca8._M_head_impl);
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
        testing::Message::~Message((Message *)0x111b04);
      }
      local_32c = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x111b26);
      if (local_32c == 0) {
        testing::internal::EqHelper::Compare<long,_long,_nullptr>
                  ((char *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                   (char *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,
                   (long *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
        bVar1 = testing::AssertionResult::operator_cast_to_bool
                          ((AssertionResult *)&stack0xfffffffffffffc80);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffc60);
          testing::AssertionResult::failure_message((AssertionResult *)0x111b85);
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c,
                     (char *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c,
                     (char *)in_stack_fffffffffffffc40);
          testing::internal::AssertHelper::operator=
                    (in_stack_fffffffffffffcb0,(Message *)in_stack_fffffffffffffca8._M_head_impl);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
          testing::Message::~Message((Message *)0x111bc6);
        }
        local_32c = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x111be8);
        if (local_32c == 0) {
          local_68 = 8;
          local_14 = 3;
          local_308 = passthrough_resampler<float>::fill
                                (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
                                 in_stack_fffffffffffffc90,in_stack_fffffffffffffc88._M_head_impl,
                                 in_stack_fffffffffffffc80);
          testing::internal::EqHelper::Compare<long,_long,_nullptr>
                    ((char *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                     (char *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,
                     (long *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
          bVar1 = testing::AssertionResult::operator_cast_to_bool
                            ((AssertionResult *)&stack0xfffffffffffffc60);
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_fffffffffffffc60);
            testing::AssertionResult::failure_message((AssertionResult *)0x111c91);
            testing::internal::AssertHelper::AssertHelper
                      (in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c,
                       (char *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c,
                       (char *)in_stack_fffffffffffffc40);
            testing::internal::AssertHelper::operator=
                      (in_stack_fffffffffffffcb0,(Message *)in_stack_fffffffffffffca8._M_head_impl);
            testing::internal::AssertHelper::~AssertHelper
                      ((AssertHelper *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30)
                      );
            testing::Message::~Message((Message *)0x111cd2);
          }
          local_32c = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x111cf4);
          if (local_32c == 0) {
            testing::internal::EqHelper::Compare<long,_long,_nullptr>
                      ((char *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                       (char *)in_stack_fffffffffffffc40,(long *)0x18,
                       (long *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
            bVar1 = testing::AssertionResult::operator_cast_to_bool
                              ((AssertionResult *)&stack0xfffffffffffffc40);
            if (!bVar1) {
              testing::Message::Message((Message *)in_stack_fffffffffffffc60);
              testing::AssertionResult::failure_message((AssertionResult *)0x111d59);
              testing::internal::AssertHelper::AssertHelper
                        (in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c,
                         (char *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c,
                         (char *)in_stack_fffffffffffffc40);
              testing::internal::AssertHelper::operator=
                        (in_stack_fffffffffffffcb0,(Message *)in_stack_fffffffffffffca8._M_head_impl
                        );
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)
                         CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
              testing::Message::~Message((Message *)0x111d94);
            }
            local_32c = (uint)!bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x111db6);
            if (local_32c == 0) {
              local_32c = 0;
            }
          }
        }
      }
    }
  }
  passthrough_resampler<float>::~passthrough_resampler
            ((passthrough_resampler<float> *)
             CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
  return;
}

Assistant:

TEST(cubeb, passthrough_resampler_fill_input_left)
{
  const uint32_t channels = 2;
  const uint32_t sample_rate = 44100;
  int iteration = 0;
  passthrough_resampler<float> resampler = passthrough_resampler<float>(
      nullptr, passthrough_resampler_fill_input_left, &iteration, channels,
      sample_rate);

  long input_frame_count = 48; // 32 + 16
  const long output_frame_count = 32;
  float input[96] = {};
  float output[64] = {};
  for (uint32_t i = 0; i < input_frame_count * channels; ++i) {
    input[i] = 0.01 * i;
  }

  // 1st iteration, add the extra input.
  iteration = 1;
  long got =
      resampler.fill(input, &input_frame_count, output, output_frame_count);
  ASSERT_EQ(got, output_frame_count);
  // Input frames used must be equal to output frames.
  ASSERT_EQ(input_frame_count, output_frame_count);

  // 2st iteration, use the extra input from previous iteration,
  // 16 frames are remaining in the input buffer.
  input_frame_count = 32; // we need 16 input frames but we get more;
  iteration = 2;
  got = resampler.fill(input, &input_frame_count, output, output_frame_count);
  ASSERT_EQ(got, output_frame_count);
  // Input frames used must be equal to output frames.
  ASSERT_EQ(input_frame_count, output_frame_count);

  // 3rd iteration, use the extra input from previous iteration.
  // 16 frames are remaining in the input buffer.
  input_frame_count = 16 - 8; // We need 16 more input frames but we only get 8.
  iteration = 3;
  got = resampler.fill(input, &input_frame_count, output, output_frame_count);
  ASSERT_EQ(got, output_frame_count);
  // Input frames used are less than the output frames due to glitch.
  ASSERT_EQ(input_frame_count, output_frame_count - 8);
}